

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_vdpu2.c
# Opt level: O1

MPP_RET jpegd_gen_regs(JpegdHalCtx *ctx,JpegdSyntax *syntax)

{
  byte bVar1;
  RK_U8 RVar2;
  void *__s;
  void *pvVar3;
  AcTable *pAVar4;
  DcTable *pDVar5;
  byte bVar6;
  byte bVar7;
  ushort uVar8;
  undefined2 uVar9;
  uint uVar10;
  int iVar11;
  PpRgbCfg *pPVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  char *pcVar16;
  DcTable *pDVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  AcTable *pAVar23;
  uint *puVar24;
  RK_U32 offset;
  
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","enter\n","jpegd_gen_regs");
  }
  __s = ctx->regs;
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","enter\n","jpegd_regs_init");
  }
  memset(__s,0,0x27c);
  *(uint *)((long)__s + 200) = *(uint *)((long)__s + 200) & 0xfffffb80;
  *(uint *)((long)__s + 0xd8) = *(uint *)((long)__s + 0xd8) & 0xffffffc0 | 0x3e;
  *(byte *)((long)__s + 0xdc) = *(byte *)((long)__s + 0xdc) & 0xfd;
  *(uint *)((long)__s + 0xe0) = *(uint *)((long)__s + 0xe0) & 0xffa00000 | 0x1000ff;
  *(byte *)((long)__s + 0xe4) = *(byte *)((long)__s + 0xe4) | 0x30;
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","exit\n","jpegd_regs_init");
  }
  *(byte *)((long)__s + 0xc9) = *(byte *)((long)__s + 0xc9) | 1;
  *(undefined4 *)((long)__s + 0xd4) = 3;
  *(uint *)((long)__s + 0xe4) = (*(uint *)((long)__s + 0xe4) & 0xffebfffa) + 1;
  uVar13 = syntax->ver_stride >> 0xc & 7;
  uVar10 = *(uint *)((long)__s + 0x1e0);
  *(uint *)((long)__s + 0x1e0) = uVar10 & 0xfffffff8 | uVar13;
  uVar14 = syntax->hor_stride >> 10 & 0x38;
  *(uint *)((long)__s + 0x1e0) = uVar10 & 0xffffffc0 | uVar13 | uVar14;
  uVar15 = (syntax->hor_stride & 0xfffffff0) << 0x13;
  *(uint *)((long)__s + 0x1e0) = uVar10 & 0x7fffc0 | uVar13 | uVar14 | uVar15;
  *(uint *)((long)__s + 0x1e0) =
       uVar10 & 0x7807c0 | uVar13 | uVar14 | uVar15 | (syntax->ver_stride & 0xff0) << 7;
  uVar13 = (syntax->fill_bottom & 1) << 0x1a;
  uVar10 = *(uint *)((long)__s + 0x1e4);
  *(uint *)((long)__s + 0x1e4) = uVar10 & 0xfbffffff | uVar13;
  uVar10 = uVar10 & 0xfbff00ff | uVar13 | (uint)syntax->scan_start << 8;
  *(uint *)((long)__s + 0x1e4) = uVar10;
  uVar10 = CONCAT31((int3)(uVar10 >> 8),syntax->scan_end);
  *(uint *)((long)__s + 0x1e4) = uVar10;
  uVar13 = (syntax->prev_shift & 0xf) << 0x14;
  *(uint *)((long)__s + 0x1e4) = uVar10 & 0xff0fffff | uVar13;
  *(uint *)((long)__s + 0x1e4) =
       uVar10 & 0xff00ffff | uVar13 | (syntax->point_transform & 0xf) << 0x10;
  uVar10 = *(uint *)((long)__s + 0x1e8);
  uVar13 = (syntax->qtable_cnt & 3) << 0xb;
  *(uint *)((long)__s + 0x1e8) = uVar10 & 0xffffe7ff | uVar13;
  uVar14 = (syntax->yuv_mode & 7) << 8;
  *(uint *)((long)__s + 0x1e8) = uVar10 & 0xffffe0ff | uVar13 | uVar14;
  *(uint *)((long)__s + 0x1e8) =
       uVar10 & 0xffffe07f | uVar13 | uVar14 | (uint)(byte)(syntax->fill_right << 7);
  uVar10 = *(uint *)((long)__s + 0x250) & 0xffdfff00;
  *(uint *)((long)__s + 0x250) = uVar10 + 0x200000;
  if (((((syntax->height & 0xf) - 1 < 8) && ((ctx->pp_info).pp_enable == '\0')) &&
      (syntax->yuv_mode < 7)) && ((0x58U >> (syntax->yuv_mode & 0x1f) & 1) != 0)) {
    *(uint *)((long)__s + 0x250) = uVar10 | 0x300000;
  }
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","enter\n","jpegd_write_code_word_number");
  }
  pvVar3 = ctx->regs;
  pAVar23 = syntax->ac_table + 1;
  pAVar4 = syntax->ac_table;
  if (syntax->ac_index[0] == 0) {
    pAVar23 = syntax->ac_table;
    pAVar4 = syntax->ac_table + 1;
  }
  uVar13 = pAVar23->bits[0] & 3;
  uVar10 = *(uint *)((long)pvVar3 + 0x218);
  *(uint *)((long)pvVar3 + 0x218) = uVar10 & 0xfffffffc | uVar13;
  uVar10 = (uVar10 & 0xffffffc4 | uVar13) + (pAVar23->bits[1] & 7) * 8;
  *(uint *)((long)pvVar3 + 0x218) = uVar10;
  uVar13 = (pAVar23->bits[2] & 0xf) << 7;
  *(uint *)((long)pvVar3 + 0x218) = uVar10 & 0xfffff87f | uVar13;
  uVar14 = (pAVar23->bits[3] & 0x1f) << 0xb;
  *(uint *)((long)pvVar3 + 0x218) = uVar10 & 0xffff007f | uVar13 | uVar14;
  uVar15 = (pAVar23->bits[4] & 0x3f) << 0x10;
  *(uint *)((long)pvVar3 + 0x218) = uVar10 & 0xffc0007f | uVar13 | uVar14 | uVar15;
  *(uint *)((long)pvVar3 + 0x218) =
       uVar10 & 0x80c0007f | uVar13 | uVar14 | uVar15 | (pAVar23->bits[5] & 0x7f) << 0x18;
  bVar1 = (byte)pAVar23->bits[6];
  uVar10 = CONCAT31((int3)((uint)*(undefined4 *)((long)pvVar3 + 0x21c) >> 8),bVar1);
  *(uint *)((long)pvVar3 + 0x21c) = uVar10;
  uVar13 = (pAVar23->bits[7] & 0xff) << 8;
  *(uint *)((long)pvVar3 + 0x21c) = uVar10 & 0xffff00ff | uVar13;
  uVar14 = (pAVar23->bits[8] & 0xff) << 0x10;
  *(uint *)((long)pvVar3 + 0x21c) = uVar10 & 0xff0000ff | uVar13 | uVar14;
  *(uint *)((long)pvVar3 + 0x21c) = bVar1 | uVar13 | uVar14 | pAVar23->bits[9] << 0x18;
  bVar1 = (byte)pAVar23->bits[10];
  uVar10 = CONCAT31((int3)((uint)*(undefined4 *)((long)pvVar3 + 0x220) >> 8),bVar1);
  *(uint *)((long)pvVar3 + 0x220) = uVar10;
  uVar13 = (pAVar23->bits[0xb] & 0xff) << 8;
  *(uint *)((long)pvVar3 + 0x220) = uVar10 & 0xffff00ff | uVar13;
  uVar14 = (pAVar23->bits[0xc] & 0xff) << 0x10;
  *(uint *)((long)pvVar3 + 0x220) = uVar10 & 0xff0000ff | uVar13 | uVar14;
  *(uint *)((long)pvVar3 + 0x220) = bVar1 | uVar13 | uVar14 | pAVar23->bits[0xd] << 0x18;
  uVar10 = CONCAT31((int3)((uint)*(undefined4 *)((long)pvVar3 + 0x224) >> 8),
                    (char)pAVar23->bits[0xe]);
  *(uint *)((long)pvVar3 + 0x224) = uVar10;
  uVar13 = (pAVar23->bits[0xf] & 0xff) << 8;
  *(uint *)((long)pvVar3 + 0x224) = uVar10 & 0xffff00ff | uVar13;
  uVar14 = (pAVar4->bits[0] & 3) << 0x10;
  *(uint *)((long)pvVar3 + 0x224) = uVar10 & 0xfffc00ff | uVar13 | uVar14;
  uVar15 = (pAVar4->bits[1] & 7) << 0x13;
  *(uint *)((long)pvVar3 + 0x224) = uVar10 & 0xffc400ff | uVar13 | uVar14 | uVar15;
  uVar22 = (pAVar4->bits[2] & 0xf) << 0x17;
  *(uint *)((long)pvVar3 + 0x224) = uVar10 & 0xf84400ff | uVar13 | uVar14 | uVar15 | uVar22;
  *(uint *)((long)pvVar3 + 0x224) =
       uVar10 & 0x4400ff | uVar13 | uVar14 | uVar15 | uVar22 | pAVar4->bits[3] << 0x1b;
  uVar10 = *(uint *)((long)pvVar3 + 0x228);
  uVar13 = pAVar4->bits[4] & 0x3f;
  *(uint *)((long)pvVar3 + 0x228) = uVar10 & 0xffffffc0 | uVar13;
  uVar14 = (pAVar4->bits[5] & 0x7f) << 8;
  *(uint *)((long)pvVar3 + 0x228) = uVar10 & 0xffff80c0 | uVar13 | uVar14;
  uVar15 = (pAVar4->bits[6] & 0xff) << 0x10;
  *(uint *)((long)pvVar3 + 0x228) = uVar10 & 0xff0080c0 | uVar13 | uVar14 | uVar15;
  *(uint *)((long)pvVar3 + 0x228) =
       uVar10 & 0x80c0 | uVar13 | uVar14 | uVar15 | pAVar4->bits[7] << 0x18;
  bVar1 = (byte)pAVar4->bits[8];
  uVar10 = CONCAT31((int3)((uint)*(undefined4 *)((long)pvVar3 + 0x22c) >> 8),bVar1);
  *(uint *)((long)pvVar3 + 0x22c) = uVar10;
  uVar13 = (pAVar4->bits[9] & 0xff) << 8;
  *(uint *)((long)pvVar3 + 0x22c) = uVar10 & 0xffff00ff | uVar13;
  uVar14 = (pAVar4->bits[10] & 0xff) << 0x10;
  *(uint *)((long)pvVar3 + 0x22c) = uVar10 & 0xff0000ff | uVar13 | uVar14;
  *(uint *)((long)pvVar3 + 0x22c) = bVar1 | uVar13 | uVar14 | pAVar4->bits[0xb] << 0x18;
  bVar1 = (byte)pAVar4->bits[0xc];
  uVar10 = CONCAT31((int3)((uint)*(undefined4 *)((long)pvVar3 + 0x230) >> 8),bVar1);
  *(uint *)((long)pvVar3 + 0x230) = uVar10;
  uVar14 = (pAVar4->bits[0xd] & 0xff) << 8;
  *(uint *)((long)pvVar3 + 0x230) = uVar10 & 0xffff00ff | uVar14;
  uVar13 = (pAVar4->bits[0xe] & 0xff) << 0x10;
  *(uint *)((long)pvVar3 + 0x230) = uVar10 & 0xff0000ff | uVar14 | uVar13;
  *(uint *)((long)pvVar3 + 0x230) = bVar1 | uVar14 | uVar13 | pAVar4->bits[0xf] << 0x18;
  pDVar17 = syntax->dc_table;
  pDVar5 = syntax->dc_table + 1;
  if (syntax->dc_index[0] == 0) {
    pDVar17 = syntax->dc_table + 1;
    pDVar5 = syntax->dc_table;
  }
  uVar10 = *(uint *)((long)pvVar3 + 0x234);
  uVar13 = pDVar5->bits[0] & 3;
  *(uint *)((long)pvVar3 + 0x234) = uVar10 & 0xfffffffc | uVar13;
  uVar14 = (pDVar5->bits[1] & 7) << 4;
  *(uint *)((long)pvVar3 + 0x234) = uVar10 & 0xffffff8c | uVar13 | uVar14;
  uVar15 = (pDVar5->bits[2] & 0xf) << 8;
  *(uint *)((long)pvVar3 + 0x234) = uVar10 & 0xfffff08c | uVar13 | uVar14 | uVar15;
  uVar22 = (pDVar5->bits[3] & 0xf) << 0xc;
  *(uint *)((long)pvVar3 + 0x234) = uVar10 & 0xffff008c | uVar13 | uVar14 | uVar15 | uVar22;
  uVar18 = (pDVar5->bits[4] & 0xf) << 0x10;
  *(uint *)((long)pvVar3 + 0x234) = uVar10 & 0xfff0008c | uVar13 | uVar14 | uVar15 | uVar22 | uVar18
  ;
  uVar19 = (pDVar5->bits[5] & 0xf) << 0x14;
  *(uint *)((long)pvVar3 + 0x234) =
       uVar10 & 0xff00008c | uVar13 | uVar14 | uVar15 | uVar22 | uVar18 | uVar19;
  uVar20 = (pDVar5->bits[6] & 0xf) << 0x18;
  *(uint *)((long)pvVar3 + 0x234) =
       uVar10 & 0xf000008c | uVar13 | uVar14 | uVar15 | uVar22 | uVar18 | uVar19 | uVar20;
  *(uint *)((long)pvVar3 + 0x234) =
       uVar10 & 0x8c | uVar13 | uVar14 | uVar15 | uVar22 | uVar18 | uVar19 | uVar20 |
       pDVar5->bits[7] << 0x1c;
  uVar10 = *(uint *)((long)pvVar3 + 0x238);
  uVar13 = pDVar5->bits[8] & 0xf;
  *(uint *)((long)pvVar3 + 0x238) = uVar10 & 0xfffffff0 | uVar13;
  uVar14 = (pDVar5->bits[9] & 0xf) << 4;
  *(uint *)((long)pvVar3 + 0x238) = uVar10 & 0xffffff00 | uVar13 | uVar14;
  uVar15 = (pDVar5->bits[10] & 0xf) << 8;
  *(uint *)((long)pvVar3 + 0x238) = uVar10 & 0xfffff000 | uVar13 | uVar14 | uVar15;
  uVar22 = (pDVar5->bits[0xb] & 0xf) << 0xc;
  *(uint *)((long)pvVar3 + 0x238) = uVar10 & 0xffff0000 | uVar13 | uVar14 | uVar15 | uVar22;
  uVar18 = (pDVar5->bits[0xc] & 0xf) << 0x10;
  *(uint *)((long)pvVar3 + 0x238) = uVar10 & 0xfff00000 | uVar13 | uVar14 | uVar15 | uVar22 | uVar18
  ;
  uVar19 = (pDVar5->bits[0xd] & 0xf) << 0x14;
  *(uint *)((long)pvVar3 + 0x238) =
       uVar10 & 0xff000000 | uVar13 | uVar14 | uVar15 | uVar22 | uVar18 | uVar19;
  uVar20 = (pDVar5->bits[0xe] & 0xf) << 0x18;
  *(uint *)((long)pvVar3 + 0x238) =
       uVar10 & 0xf0000000 | uVar13 | uVar14 | uVar15 | uVar22 | uVar18 | uVar19 | uVar20;
  *(uint *)((long)pvVar3 + 0x238) =
       uVar13 | uVar14 | uVar15 | uVar22 | uVar18 | uVar19 | uVar20 | pDVar5->bits[0xf] << 0x1c;
  uVar10 = *(uint *)((long)pvVar3 + 0x23c);
  uVar13 = pDVar17->bits[0] & 3;
  *(uint *)((long)pvVar3 + 0x23c) = uVar10 & 0xfffffffc | uVar13;
  uVar14 = (pDVar17->bits[1] & 7) << 4;
  *(uint *)((long)pvVar3 + 0x23c) = uVar10 & 0xffffff8c | uVar13 | uVar14;
  uVar15 = (pDVar17->bits[2] & 0xf) << 8;
  *(uint *)((long)pvVar3 + 0x23c) = uVar10 & 0xfffff08c | uVar13 | uVar14 | uVar15;
  uVar22 = (pDVar17->bits[3] & 0xf) << 0xc;
  *(uint *)((long)pvVar3 + 0x23c) = uVar10 & 0xffff008c | uVar13 | uVar14 | uVar15 | uVar22;
  uVar18 = (pDVar17->bits[4] & 0xf) << 0x10;
  *(uint *)((long)pvVar3 + 0x23c) = uVar10 & 0xfff0008c | uVar13 | uVar14 | uVar15 | uVar22 | uVar18
  ;
  uVar19 = (pDVar17->bits[5] & 0xf) << 0x14;
  *(uint *)((long)pvVar3 + 0x23c) =
       uVar10 & 0xff00008c | uVar13 | uVar14 | uVar15 | uVar22 | uVar18 | uVar19;
  uVar20 = (pDVar17->bits[6] & 0xf) << 0x18;
  *(uint *)((long)pvVar3 + 0x23c) =
       uVar10 & 0xf000008c | uVar13 | uVar14 | uVar15 | uVar22 | uVar18 | uVar19 | uVar20;
  *(uint *)((long)pvVar3 + 0x23c) =
       uVar10 & 0x8c | uVar13 | uVar14 | uVar15 | uVar22 | uVar18 | uVar19 | uVar20 |
       pDVar17->bits[7] << 0x1c;
  uVar10 = *(uint *)((long)pvVar3 + 0x240);
  uVar19 = pDVar17->bits[8] & 0xf;
  *(uint *)((long)pvVar3 + 0x240) = uVar10 & 0xfffffff0 | uVar19;
  uVar20 = (pDVar17->bits[9] & 0xf) << 4;
  *(uint *)((long)pvVar3 + 0x240) = uVar10 & 0xffffff00 | uVar19 | uVar20;
  uVar22 = (pDVar17->bits[10] & 0xf) << 8;
  *(uint *)((long)pvVar3 + 0x240) = uVar10 & 0xfffff000 | uVar19 | uVar20 | uVar22;
  uVar18 = (pDVar17->bits[0xb] & 0xf) << 0xc;
  *(uint *)((long)pvVar3 + 0x240) = uVar10 & 0xffff0000 | uVar19 | uVar20 | uVar22 | uVar18;
  uVar13 = (pDVar17->bits[0xc] & 0xf) << 0x10;
  *(uint *)((long)pvVar3 + 0x240) = uVar10 & 0xfff00000 | uVar19 | uVar20 | uVar22 | uVar18 | uVar13
  ;
  uVar14 = (pDVar17->bits[0xd] & 0xf) << 0x14;
  *(uint *)((long)pvVar3 + 0x240) =
       uVar10 & 0xff000000 | uVar19 | uVar20 | uVar22 | uVar18 | uVar13 | uVar14;
  uVar15 = (pDVar17->bits[0xe] & 0xf) << 0x18;
  *(uint *)((long)pvVar3 + 0x240) =
       uVar10 & 0xf0000000 | uVar19 | uVar20 | uVar22 | uVar18 | uVar13 | uVar14 | uVar15;
  *(uint *)((long)pvVar3 + 0x240) =
       uVar19 | uVar20 | uVar22 | uVar18 | uVar13 | uVar14 | uVar15 | pDVar17->bits[0xf] << 0x1c;
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","exit\n","jpegd_write_code_word_number");
  }
  jpegd_write_qp_ac_dc_table(ctx,syntax);
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","enter\n","jpegd_set_chroma_table_id");
  }
  pvVar3 = ctx->regs;
  if (syntax->ac_index[0] == 0) {
    uVar10 = *(uint *)((long)pvVar3 + 0x1e8);
    uVar13 = (syntax->ac_index[1] & 1) << 4;
    *(uint *)((long)pvVar3 + 0x1e8) = uVar10 & 0xffffffef | uVar13;
    uVar10 = uVar10 & 0xffffffcf | uVar13 | (syntax->ac_index[2] & 1) << 5;
  }
  else {
    uVar13 = *(uint *)((long)pvVar3 + 0x1e8);
    uVar10 = (uint)(syntax->ac_index[0] != syntax->ac_index[1]) << 4;
    uVar14 = uVar10 | uVar13 & 0xffffffef;
    *(uint *)((long)pvVar3 + 0x1e8) = uVar14;
    if (syntax->ac_index[0] == syntax->ac_index[2]) {
      uVar10 = uVar10 | uVar13 & 0xffffffcf;
    }
    else {
      uVar10 = uVar14 | 0x20;
    }
  }
  *(uint *)((long)pvVar3 + 0x1e8) = uVar10;
  if (syntax->dc_index[0] == 0) {
    uVar10 = (*(uint *)((long)pvVar3 + 0x1e8) & 0xfffffffb) + (syntax->dc_index[1] & 1) * 4;
    *(uint *)((long)pvVar3 + 0x1e8) = uVar10;
    uVar10 = (uVar10 & 0xfffffff7) + (syntax->dc_index[2] & 1) * 8;
  }
  else {
    uVar10 = (*(uint *)((long)pvVar3 + 0x1e8) & 0xfffffffb) +
             (uint)(syntax->dc_index[0] != syntax->dc_index[1]) * 4;
    *(uint *)((long)pvVar3 + 0x1e8) = uVar10;
    if (syntax->dc_index[0] == syntax->dc_index[2]) {
      uVar10 = uVar10 & 0xfffffff7;
    }
    else {
      uVar10 = uVar10 | 8;
    }
  }
  *(uint *)((long)pvVar3 + 0x1e8) = uVar10;
  *(byte *)((long)pvVar3 + 0x1e8) = *(byte *)((long)pvVar3 + 0x1e8) & 0xfc;
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","exit\n","jpegd_set_chroma_table_id");
  }
  iVar11 = mpp_buffer_get_fd_with_caller(ctx->pTableBase,"jpegd_gen_regs");
  *(int *)((long)__s + 0xf4) = iVar11;
  if (iVar11 == 0) {
    _mpp_log_l(2,"HAL_JPEG_VDPU2","get qtable_base failed\n","jpegd_gen_regs");
    return MPP_NOK;
  }
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","enter\n","jpegd_set_stream_offset");
  }
  pvVar3 = ctx->regs;
  uVar10 = syntax->strm_offset;
  *(RK_S32 *)((long)pvVar3 + 0x100) = ctx->pkt_fd;
  uVar10 = uVar10 & 0xfffffff8;
  if (uVar10 != 0) {
    mpp_dev_set_reg_offset(ctx->dev,0x40,uVar10);
  }
  uVar13 = *(uint *)((long)pvVar3 + 0x1e8) & 0x3ffffff | *(int *)&syntax->cur_pos << 0x1d;
  *(uint *)((long)pvVar3 + 0x1e8) = uVar13;
  *(RK_U32 *)((long)pvVar3 + 0xcc) =
       syntax->pkt_len - uVar10 & 0xffffff | (uint)*(byte *)((long)pvVar3 + 0xcf) << 0x18;
  *(uint *)((long)pvVar3 + 0x1e8) = uVar13 | 0x40;
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","exit\n","jpegd_set_stream_offset");
  }
  if (syntax->restart_interval == 0) {
    *(uint *)((long)__s + 0x1e8) = *(uint *)((long)__s + 0x1e8) & 0xfdffffff;
  }
  else {
    *(uint *)((long)__s + 0x1e8) = *(uint *)((long)__s + 0x1e8) | 0x2000000;
    *(short *)((long)__s + 0x1ec) = (short)syntax->restart_interval;
  }
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","enter\n","jpegd_setup_pp");
  }
  puVar24 = (uint *)ctx->regs;
  bVar1 = (ctx->pp_info).pp_in_fmt;
  bVar6 = (ctx->pp_info).pp_out_fmt;
  uVar21 = (ulong)bVar6;
  RVar2 = (ctx->pp_info).dither_enable;
  uVar18 = (ctx->pp_info).crop_width;
  uVar22 = (ctx->pp_info).crop_height;
  uVar10 = (ctx->pp_info).crop_x;
  uVar13 = (ctx->pp_info).crop_y;
  uVar14 = syntax->hor_stride;
  uVar15 = syntax->ver_stride;
  *puVar24 = *puVar24 & 0xff0000c0 | 0x30;
  puVar24[0x12] = 0;
  uVar19 = (uVar14 & 0x1ff0) << 8;
  puVar24[0x22] = puVar24[0x22] & 0xffe00fff | uVar19;
  puVar24[0x25] = puVar24[0x25] | 0xb0f;
  puVar24[0x29] = puVar24[0x29] | 0x10010008;
  if (uVar18 == 0) {
    puVar24[0x22] = (uVar15 & 0xfffffff0) << 0x11 | uVar14 >> 4 & 0xfff | uVar19;
    uVar18 = uVar14;
    uVar22 = uVar15;
  }
  else {
    puVar24[0x22] = (uVar22 & 0xfffffff0) << 0x11 | uVar18 >> 4 & 0xfff | uVar19;
    puVar24[0xe] = (uint)((uVar18 & 0xf) != 0) << 0x1d | (uVar10 & 0xe000) << 0xb |
                   uVar10 >> 4 & 0x1ff | (uint)((uVar22 & 0xf) != 0) << 0x1c | uVar13 >> 3 & 0xe00 |
                   (uVar13 & 0xff0) << 0xc | puVar24[0xe] & 0xc800f000;
  }
  *(ushort *)(puVar24 + 0x27) = (ushort)puVar24[0x27] & 0xf000 | (ushort)uVar14 & 0xfff;
  puVar24[0x23] = uVar15 << 0x10 & 0x7ff0000 | uVar14 & 0x7ff | puVar24[0x23] & 0xf800f800;
  if (6 < bVar1) {
    if (bVar1 == 7) {
      uVar10 = puVar24[0x26] & 0xfff8f8ff | 0x700;
LAB_002109da:
      puVar24[0x26] = uVar10;
      goto LAB_002109e1;
    }
    if (bVar1 == 8) {
      uVar10 = puVar24[0x26] & 0xfff8f8ff | 0x10000;
      goto LAB_002109da;
    }
    pcVar16 = "unsupported format:%d";
    uVar21 = (ulong)(uint)bVar1;
LAB_00210ea2:
    _mpp_log_l(2,"HAL_JPEG_VDPU2",pcVar16,"jpegd_setup_pp",uVar21);
    goto LAB_00210ea9;
  }
  puVar24[0x26] = puVar24[0x26] & 0xfffff8ff | (bVar1 & 7) << 8;
LAB_002109e1:
  uVar8 = (ushort)puVar24[0xf] & 0xe0e0;
  *(ushort *)(puVar24 + 0xf) = uVar8 + 0x909;
  *(undefined1 *)(puVar24 + 3) = 4;
  if (bVar6 < 2) {
    *(ushort *)(puVar24 + 0xf) = uVar8 | 0x929;
    *(undefined2 *)(puVar24 + 0x1f) = 0xa537;
    puVar24[0x20] = puVar24[0x20] & 0xfc00fc00;
    *(byte *)(puVar24 + 0x25) = (byte)puVar24[0x25] & 0xf7;
    puVar24[1] = puVar24[1] & 0xc0040100 | 0x15e40100;
    puVar24[2] = puVar24[2] & 0xc0000000 | 0x1bb158b3;
    pPVar12 = get_pp_rgb_Cfg(ctx->output_fmt);
    puVar24[9] = pPVar12->r_mask;
    puVar24[10] = pPVar12->g_mask;
    puVar24[0xb] = pPVar12->b_mask;
    uVar10 = puVar24[0x10];
    uVar13 = pPVar12->r_padd & 0x1f;
    puVar24[0x10] = uVar10 & 0xffffffe0 | uVar13;
    uVar19 = (pPVar12->g_padd & 0x1f) << 8;
    puVar24[0x10] = uVar10 & 0xffffe0e0 | uVar13 | uVar19;
    puVar24[0x10] = uVar10 & 0xffe0e0e0 | uVar13 | uVar19 | (pPVar12->b_padd & 0x1f) << 0x10;
    if (RVar2 == '\0') {
      if ((char)jpegd_debug < '\0') {
        _mpp_log_l(4,"HAL_JPEG_VDPU2","we do not dither.",(char *)0x0);
      }
    }
    else {
      if ((char)jpegd_debug < '\0') {
        _mpp_log_l(4,"HAL_JPEG_VDPU2","we do dither.",(char *)0x0);
      }
      bVar1 = (byte)puVar24[0x24];
      bVar6 = pPVar12->r_dither & 3;
      *(byte *)(puVar24 + 0x24) = bVar1 & 0xfc | bVar6;
      bVar7 = (pPVar12->g_dither & 3) << 2;
      *(byte *)(puVar24 + 0x24) = bVar1 & 0xf0 | bVar6 | bVar7;
      *(byte *)(puVar24 + 0x24) = bVar1 & 0xc0 | bVar6 | bVar7 | (pPVar12->b_dither & 3) << 4;
    }
    uVar10._0_1_ = pPVar12->rgb_in_32;
    uVar10._1_1_ = pPVar12->r_padd;
    uVar10._2_1_ = pPVar12->g_padd;
    uVar10._3_1_ = pPVar12->b_padd;
    uVar13 = puVar24[0x25];
    uVar10 = (uVar10 & 1) << 4;
    puVar24[0x25] = uVar13 & 0xffffffef | uVar10;
    uVar19 = (pPVar12->swap_16 & 1) << 10;
    puVar24[0x25] = uVar13 & 0xfffffbef | uVar10 | uVar19;
    uVar20 = (pPVar12->swap_32 & 1) << 0xb;
    puVar24[0x25] = uVar13 & 0xfffff3ef | uVar10 | uVar19 | uVar20;
    puVar24[0x25] = (uVar13 & 0xfffff3e7 | uVar10 | uVar19 | uVar20) + (pPVar12->out_endian & 1) * 8
    ;
    *(byte *)((long)puVar24 + 0x99) = *(byte *)((long)puVar24 + 0x99) & 199;
  }
  else {
    if (bVar6 == 5) {
      uVar10 = puVar24[0x26] & 0xffffc7ff | 0x2800;
    }
    else {
      if (bVar6 != 3) {
        pcVar16 = "unsuppotred format:%d";
        goto LAB_00210ea2;
      }
      uVar10 = puVar24[0x26] & 0xffffc7ff | 0x1800;
    }
    puVar24[0x26] = uVar10;
  }
  *(byte *)(puVar24 + 0x26) = (byte)puVar24[0x26] & 0xf8;
  uVar20 = uVar18 - 1;
  uVar19 = uVar22 - 1;
  uVar13 = uVar14 - 1;
  uVar10 = uVar15 - 1;
  if (uVar20 < uVar13) {
    puVar24[4] = ((uVar13 * 0x10000) / uVar20 & 0x3ffff) + (puVar24[4] & 0xfff00000) + 0x40000;
    uVar9 = (undefined2)((uVar20 * 0x10000) / uVar13);
LAB_00210c92:
    *(undefined2 *)(puVar24 + 6) = uVar9;
  }
  else {
    if (uVar13 < uVar20) {
      puVar24[4] = puVar24[4] & 0xfff3ffff | 0x80000;
      uVar9 = (undefined2)((uVar14 << 0x10) / uVar18);
      goto LAB_00210c92;
    }
    puVar24[4] = puVar24[4] & 0xfff3ffff;
  }
  if (uVar19 < uVar10) {
    puVar24[4] = puVar24[4] & 0xffcfffff | 0x100000;
    puVar24[5] = puVar24[5] & 0xfffc0000 | (uVar10 * 0x10000) / uVar19 & 0x3ffff;
    uVar9 = (undefined2)((uVar19 * 0x10000) / uVar10);
LAB_00210cfe:
    *(undefined2 *)((long)puVar24 + 0x1a) = uVar9;
  }
  else {
    if (uVar10 < uVar19) {
      puVar24[4] = puVar24[4] & 0xffcfffff | 0x200000;
      uVar9 = (undefined2)(((uVar15 << 0x10) / uVar22) * 0x10000 + 0x10000 >> 0x10);
      goto LAB_00210cfe;
    }
    puVar24[4] = puVar24[4] & 0xffcfffff;
  }
  uVar13._0_1_ = (ctx->pp_info).pp_enable;
  uVar13._1_1_ = (ctx->pp_info).pp_in_fmt;
  uVar13._2_1_ = (ctx->pp_info).pp_out_fmt;
  uVar13._3_1_ = (ctx->pp_info).dither_enable;
  puVar24[0x29] = puVar24[0x29] & 0xffffffef | (uVar13 & 1) << 4;
  if ((jpegd_debug & 0x80) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","pp_enable %d\n",(char *)0x0,(ulong)(ctx->pp_info).pp_enable);
  }
  offset = uVar15 * uVar14;
  if ((ctx->pp_info).pp_enable == '\0') {
    *(byte *)(puVar24 + 0x39) = (byte)puVar24[0x39] & 0xfb;
    puVar24[0x29] = puVar24[0x29] & 0xffffffef;
    puVar24[0x15] = 0;
    puVar24[0x16] = 0;
    uVar10 = ctx->frame_fd;
    puVar24[0x3f] = uVar10;
    puVar24[0x83] = uVar10;
    if (offset != 0) {
      mpp_dev_set_reg_offset(ctx->dev,0x83,offset);
    }
    if ((jpegd_debug & 0x80) != 0) {
      puVar24 = puVar24 + 0x83;
      pcVar16 = "output_frame_fd:%x, reg131:%x";
      goto LAB_00210e21;
    }
  }
  else {
    *(byte *)(puVar24 + 0x39) = (byte)puVar24[0x39] | 4;
    puVar24[0x29] = puVar24[0x29] | 0x10;
    puVar24[0x3f] = 0;
    puVar24[0x83] = 0;
    uVar10 = ctx->frame_fd;
    puVar24[0x15] = uVar10;
    puVar24[0x16] = uVar10;
    if (offset != 0) {
      mpp_dev_set_reg_offset(ctx->dev,0x16,offset);
    }
    if ((jpegd_debug & 0x80) != 0) {
      puVar24 = puVar24 + 0x16;
      pcVar16 = "output_frame_fd:%x, reg22:%x";
LAB_00210e21:
      _mpp_log_l(4,"HAL_JPEG_VDPU2",pcVar16,(char *)0x0,(ulong)(uint)ctx->frame_fd,(ulong)*puVar24);
    }
  }
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","exit\n","jpegd_setup_pp");
  }
LAB_00210ea9:
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","exit\n","jpegd_gen_regs");
  }
  return MPP_OK;
}

Assistant:

static
MPP_RET jpegd_gen_regs(JpegdHalCtx *ctx, JpegdSyntax *syntax)
{
    MPP_RET ret = MPP_OK;
    jpegd_dbg_func("enter\n");
    JpegdIocRegInfo *info = (JpegdIocRegInfo *)ctx->regs;
    JpegRegSet *reg = &(info->regs);
    JpegdSyntax *s = syntax;

    jpegd_regs_init(reg);

    reg->reg50_dec_ctrl.sw_filtering_dis = 1;
    reg->reg53_dec_mode = DEC_MODE_JPEG;

    reg->reg57_enable_ctrl.sw_dec_e = 1;  /* Enable jpeg mode */
    reg->reg57_enable_ctrl.sw_pjpeg_e = 0;
    reg->reg57_enable_ctrl.sw_dec_out_dis = 0;
    reg->reg57_enable_ctrl.sw_rlc_mode_e = 0;

    /* frame size, round up the number of mbs */
    reg->reg120.sw_pic_mb_h_ext = ((((s->ver_stride) >> (4)) & 0x700) >> 8);
    reg->reg120.sw_pic_mb_w_ext = ((((s->hor_stride) >> (4)) & 0xE00) >> 9);
    reg->reg120.sw_pic_mb_width = ((s->hor_stride) >> (4)) & 0x1FF;
    reg->reg120.sw_pic_mb_hight_p = ((s->ver_stride) >> (4)) & 0x0FF;

    reg->reg121.sw_pjpeg_fildown_e = s->fill_bottom;
    /* Set spectral selection start coefficient */
    reg->reg121.sw_pjpeg_ss = s->scan_start;
    /* Set spectral selection end coefficient */
    reg->reg121.sw_pjpeg_se = s->scan_end;
    /* Set the point transform used in the preceding scan */
    reg->reg121.sw_pjpeg_ah = s->prev_shift;
    /* Set the point transform value */
    reg->reg121.sw_pjpeg_al = s->point_transform;

    reg->reg122.sw_jpeg_qtables = s->qtable_cnt;
    reg->reg122.sw_jpeg_mode = s->yuv_mode;
    reg->reg122.sw_jpeg_filright_e = s->fill_right;

    reg->reg148.sw_slice_h = 0;
    /* Set bit 21 of reg148 to 1, notifying hardware to decode jpeg
     * including DRI segment
     */
    reg->reg148.sw_syn_marker_e = 1;

    /* tell hardware that height is 8-pixel aligned,
     * but not 16-pixel aligned
     */
    if ((s->height % 16) && ((s->height % 16) <= 8) &&
        (!ctx->pp_info.pp_enable) &&
        (s->yuv_mode == JPEGDEC_YUV422 ||
         s->yuv_mode == JPEGDEC_YUV444 ||
         s->yuv_mode == JPEGDEC_YUV411)) {
        reg->reg148.sw_jpeg_height8_flag = 1;
    }

    /* write VLC code word number to register */
    jpegd_write_code_word_number(ctx, s);

    /* Create AC/DC/QP tables for hardware */
    jpegd_write_qp_ac_dc_table(ctx, s);

    /* Select which tables the chromas use */
    jpegd_set_chroma_table_id(ctx, s);

    /* write table base */
    reg->reg61_qtable_base = mpp_buffer_get_fd(ctx->pTableBase);
    if (reg->reg61_qtable_base <= 0) {
        mpp_err_f("get qtable_base failed\n");
        return MPP_NOK;
    }
    /* set up stream position for HW decode */
    jpegd_set_stream_offset(ctx, s);

    /* set restart interval */
    if (s->restart_interval) {
        reg->reg122.sw_sync_marker_e = 1;
        /* If exists DRI segment, bit 0 to bit 15 of reg123 is set
         * to restart interval */
        reg->reg123.sw_pjpeg_rest_freq = s->restart_interval;
    } else {
        reg->reg122.sw_sync_marker_e = 0;
    }

    jpegd_setup_pp(ctx, syntax);

    jpegd_dbg_func("exit\n");
    return ret;
}